

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O3

StringRef __thiscall llvm::sys::path::stem(path *this,StringRef path,Style style)

{
  char *pcVar1;
  char *pcVar3;
  StringRef SVar4;
  undefined1 local_40 [8];
  reverse_iterator I;
  char *pcVar2;
  
  I.Path.Data = path.Data;
  I.Path.Length = 0;
  I.Component.Data = (char *)0x0;
  I.Position._0_4_ = (undefined4)path.Length;
  local_40 = (undefined1  [8])this;
  I.Component.Length = (size_t)I.Path.Data;
  reverse_iterator::operator++((reverse_iterator *)local_40);
  pcVar2 = I.Component.Data;
  do {
    pcVar1 = pcVar2 + -1;
    pcVar3 = I.Component.Data;
    if (pcVar2 == (char *)0x0) goto LAB_00b266ba;
    pcVar3 = pcVar2 + (I.Path.Length - 1);
    pcVar2 = pcVar1;
  } while (*pcVar3 != '.');
  pcVar3 = pcVar1;
  if (I.Component.Data == (char *)0x2) {
    if (*(short *)I.Path.Length == 0x2e2e) {
      pcVar3 = (char *)0x2;
    }
  }
  else if ((I.Component.Data == &DAT_00000001) && (*(char *)I.Path.Length == '.')) {
    pcVar3 = &DAT_00000001;
  }
LAB_00b266ba:
  SVar4.Length = (size_t)pcVar3;
  SVar4.Data = (char *)I.Path.Length;
  return SVar4;
}

Assistant:

StringRef stem(StringRef path, Style style) {
  StringRef fname = filename(path, style);
  size_t pos = fname.find_last_of('.');
  if (pos == StringRef::npos)
    return fname;
  else
    if ((fname.size() == 1 && fname == ".") ||
        (fname.size() == 2 && fname == ".."))
      return fname;
    else
      return fname.substr(0, pos);
}